

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::
TransferPendingEmptyHeapBlocks<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
          *heapBucket)

{
  long lVar1;
  code *pcVar2;
  anon_class_16_2_f79d628a fn;
  bool bVar3;
  undefined8 *in_FS_OFFSET;
  uint32 local_34;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSStack_30;
  uint32 count;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *tail;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *list;
  BucketData<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *bucketData;
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
  *heapBucket_local;
  RecyclerSweep *this_local;
  
  bucketData = (BucketData<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)heapBucket;
  heapBucket_local =
       (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *)
       this;
  bVar3 = IsBackground(this);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbe,"(!this->IsBackground())","!this->IsBackground()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar3 = HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
          IsAllocationStopped((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                               *)bucketData);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xbf,"(!heapBucket->IsAllocationStopped())",
                       "!heapBucket->IsAllocationStopped()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
  VerifyHeapBlockCount
            ((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
              *)bucketData,false);
  list = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
         GetBucketData<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                   (this,(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                          *)bucketData);
  if (((BucketData<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_> *)list
      )->pendingSweepList != (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                       ,0xc3,"(bucketData.pendingSweepList == nullptr)",
                       "bucketData.pendingSweepList == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  tail = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)
         (list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
         super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.segment;
  if ((Segment *)tail == (Segment *)0x0) {
    lVar1._0_1_ = (list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  heapBlockType;
    lVar1._1_1_ = (list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  needOOMRescan;
    lVar1._2_1_ = (list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  isPendingConcurrentSweep;
    lVar1._3_1_ = (list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                  super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                  isForceSweeping;
    lVar1._4_4_ = *(undefined4 *)
                   &(list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.field_0x1c
    ;
    if (lVar1 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xe2,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                         "bucketData.pendingEmptyBlockListTail == nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  else {
    pSStack_30 = *(SmallNormalHeapBlockT<SmallAllocationBlockAttributes> **)
                  &(list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                   super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.
                   heapBlockType;
    local_34 = 0;
    fn.count = &local_34;
    fn.tail = (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)pSStack_30;
    HeapBlockList::
    ForEach<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>,Memory::RecyclerSweep::TransferPendingEmptyHeapBlocks<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>(Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>*)::_lambda(Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
              (tail,fn);
    *(uint32 *)((long)&bucketData->pendingEmptyBlockList + 4) =
         local_34 + *(int *)((long)&bucketData->pendingEmptyBlockList + 4);
    *(uint32 *)((long)&bucketData->pendingFinalizableSweptList + 4) =
         *(int *)((long)&bucketData->pendingFinalizableSweptList + 4) - local_34;
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::SetNextBlock
              (pSStack_30,
               &(bucketData[2].pendingEmptyBlockListTail)->
                super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>);
    bucketData[2].pendingEmptyBlockListTail = tail;
    (list->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
    super_SmallHeapBlockT<SmallAllocationBlockAttributes>.super_HeapBlock.segment = (Segment *)0x0;
    HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
    VerifyHeapBlockCount
              ((HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
                *)bucketData,false);
  }
  return;
}

Assistant:

void
RecyclerSweep::TransferPendingEmptyHeapBlocks(HeapBucketT<TBlockType> * heapBucket)
{
    Assert(!this->IsBackground());
    Assert(!heapBucket->IsAllocationStopped());
    RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));

    auto& bucketData = this->GetBucketData(heapBucket);
    Assert(bucketData.pendingSweepList == nullptr);
    TBlockType * list = bucketData.pendingEmptyBlockList;
    if (list)
    {
        TBlockType * tail = bucketData.pendingEmptyBlockListTail;
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        uint32 count = 0;
        HeapBlockList::ForEach(list, [tail, &count](TBlockType * heapBlock)
        {
            Assert(heapBlock->GetAddress() == nullptr);
            Assert(heapBlock->GetSegment() == nullptr);
            Assert(heapBlock->GetNextBlock() != nullptr || heapBlock == tail);
            count++;
        });
#if defined(RECYCLER_SLOW_CHECK_ENABLED)
        heapBucket->emptyHeapBlockCount += count;
#endif
#if defined(RECYCLER_SLOW_CHECK_ENABLED) || ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        heapBucket->heapBlockCount -= count;
#endif
#endif


        tail->SetNextBlock(heapBucket->emptyBlockList);
        heapBucket->emptyBlockList = list;

        bucketData.pendingEmptyBlockList = nullptr;
        RECYCLER_SLOW_CHECK(heapBucket->VerifyHeapBlockCount(false));
    }
    else
    {
        Assert(bucketData.pendingEmptyBlockListTail == nullptr);
    }
}